

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

void __thiscall
QFileSystemModelPrivate::sortChildren(QFileSystemModelPrivate *this,int column,QModelIndex *parent)

{
  long *plVar1;
  Data *pDVar2;
  Span *pSVar3;
  parameter_type t;
  QString *args;
  QFileSystemNode **ppQVar4;
  bool bVar5;
  int iVar6;
  QFileSystemNode *pQVar7;
  iterator __first;
  iterator __last;
  ulong uVar8;
  long lVar9;
  int i;
  int iVar10;
  QList<QString> *this_00;
  long lVar11;
  long in_FS_OFFSET;
  QFileSystemModelSorter __comp;
  piter local_98;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  QArrayDataPointer<QFileSystemModelPrivate::QFileSystemNode_*> local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&this->field_0x8;
  pQVar7 = node(this,parent);
  pDVar2 = (pQVar7->children).d;
  if ((pDVar2 != (Data *)0x0) && (pDVar2->size != 0)) {
    local_78.d = (Data *)0x0;
    local_78.ptr = (QFileSystemNode **)0x0;
    local_78.size = 0;
    local_98 = (piter)QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::constBegin
                                (&pQVar7->children);
    while( true ) {
      uVar8 = (ulong)local_98.d | local_98.bucket;
      if (uVar8 == 0) break;
      pSVar3 = (local_98.d)->spans;
      uVar8 = local_98.bucket >> 7;
      bVar5 = filtersAcceptsNode(this,*(QFileSystemNode **)
                                       (pSVar3[uVar8].entries
                                        [pSVar3[uVar8].offsets[(uint)local_98.bucket & 0x7f]].
                                        storage.data + 0x18));
      t = *(parameter_type *)
           ((local_98.d)->spans[local_98.bucket >> 7].entries
            [(local_98.d)->spans[local_98.bucket >> 7].offsets[(uint)local_98.bucket & 0x7f]].
            storage.data + 0x18);
      if (bVar5) {
        QList<QFileSystemModelPrivate::QFileSystemNode_*>::append
                  ((QList<QFileSystemModelPrivate::QFileSystemNode_*> *)&local_78,t);
      }
      else {
        t->isVisible = false;
      }
      QHashPrivate::
      iterator<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>::operator++
                (&local_98);
    }
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemModelSorter::QFileSystemModelSorter((QFileSystemModelSorter *)local_48,column);
    __first = QList<QFileSystemModelPrivate::QFileSystemNode_*>::begin
                        ((QList<QFileSystemModelPrivate::QFileSystemNode_*> *)&local_78);
    __last = QList<QFileSystemModelPrivate::QFileSystemNode_*>::end
                       ((QList<QFileSystemModelPrivate::QFileSystemNode_*> *)&local_78);
    QFileSystemModelSorter::QFileSystemModelSorter
              ((QFileSystemModelSorter *)local_58,(QFileSystemModelSorter *)local_48);
    __comp._8_8_ = uVar8;
    __comp.naturalCompare.d = (QCollatorPrivate *)local_58;
    std::sort<QList<QFileSystemModelPrivate::QFileSystemNode*>::iterator,QFileSystemModelSorter>
              (__first,__last,__comp);
    QCollator::~QCollator((QCollator *)local_58);
    this_00 = &pQVar7->visibleChildren;
    QList<QString>::clear(this_00);
    pQVar7->dirtyChildrenIndex = -1;
    QList<QString>::reserve(this_00,local_78.size);
    ppQVar4 = local_78.ptr;
    lVar9 = local_78.size << 3;
    for (lVar11 = 0; lVar9 != lVar11; lVar11 = lVar11 + 8) {
      args = *(QString **)((long)ppQVar4 + lVar11);
      QList<QString>::emplaceBack<QString_const&>(this_00,args);
      *(undefined1 *)((long)&args[3].d.d + 5) = 1;
    }
    if (this->disableRecursiveSort == false) {
      iVar10 = 0;
      while( true ) {
        iVar6 = (**(code **)(*plVar1 + 0x78))(plVar1,parent);
        if (iVar6 <= iVar10) break;
        local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.bucket._0_4_ = 0xaaaaaaaa;
        local_98.d = (Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>
                      *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.bucket._4_4_ = 0xaaaaaaaa;
        (**(code **)(*plVar1 + 0x60))((QModelIndex *)&local_98,plVar1,iVar10,0,parent);
        pQVar7 = node(this,(QModelIndex *)&local_98);
        if (pQVar7->isVisible == true) {
          sortChildren(this,column,(QModelIndex *)&local_98);
        }
        iVar10 = iVar10 + 1;
      }
    }
    QCollator::~QCollator((QCollator *)local_48);
    QArrayDataPointer<QFileSystemModelPrivate::QFileSystemNode_*>::~QArrayDataPointer(&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::sortChildren(int column, const QModelIndex &parent)
{
    Q_Q(QFileSystemModel);
    QFileSystemModelPrivate::QFileSystemNode *indexNode = node(parent);
    if (indexNode->children.size() == 0)
        return;

    QList<QFileSystemModelPrivate::QFileSystemNode *> values;

    for (auto iterator = indexNode->children.constBegin(), cend = indexNode->children.constEnd(); iterator != cend; ++iterator) {
        if (filtersAcceptsNode(iterator.value())) {
            values.append(iterator.value());
        } else {
            iterator.value()->isVisible = false;
        }
    }
    QFileSystemModelSorter ms(column);
    std::sort(values.begin(), values.end(), ms);
    // First update the new visible list
    indexNode->visibleChildren.clear();
    //No more dirty item we reset our internal dirty index
    indexNode->dirtyChildrenIndex = -1;
    indexNode->visibleChildren.reserve(values.size());
    for (QFileSystemNode *node : std::as_const(values)) {
        indexNode->visibleChildren.append(node->fileName);
        node->isVisible = true;
    }

    if (!disableRecursiveSort) {
        for (int i = 0; i < q->rowCount(parent); ++i) {
            const QModelIndex childIndex = q->index(i, 0, parent);
            QFileSystemModelPrivate::QFileSystemNode *indexNode = node(childIndex);
            //Only do a recursive sort on visible nodes
            if (indexNode->isVisible)
                sortChildren(column, childIndex);
        }
    }
}